

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::
DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test::
~DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test
          (DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test
            ((DatarateTestSVC_BasicRateTargetingSVC2TL1SLScreenDropFrame_Test *)(this + -0x18));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC2TL1SLScreenDropFrame) {
  BasicRateTargetingSVC2TL1SLScreenDropFrameTest();
}